

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessRestoreDefaultSignalHandlers(void)

{
  _union_1457 local_a0;
  sigaction act;
  
  memset(&local_a0,0,0x98);
  local_a0.sa_handler = (__sighandler_t)0x0;
  sigaction(1,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(2,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(3,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(4,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(5,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(6,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(6,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(7,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(8,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(10,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0xc,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0xd,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0xe,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x10,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x11,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x11,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x12,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x14,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x15,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x16,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x17,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x18,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x19,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1a,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1b,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1c,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1d,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1d,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1e,(sigaction *)&local_a0,(sigaction *)0x0);
  sigaction(0x1f,(sigaction *)&local_a0,(sigaction *)0x0);
  return;
}

Assistant:

static void kwsysProcessRestoreDefaultSignalHandlers(void)
{
  struct sigaction act;
  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_DFL;
#ifdef SIGHUP
  sigaction(SIGHUP, &act, 0);
#endif
#ifdef SIGINT
  sigaction(SIGINT, &act, 0);
#endif
#ifdef SIGQUIT
  sigaction(SIGQUIT, &act, 0);
#endif
#ifdef SIGILL
  sigaction(SIGILL, &act, 0);
#endif
#ifdef SIGTRAP
  sigaction(SIGTRAP, &act, 0);
#endif
#ifdef SIGABRT
  sigaction(SIGABRT, &act, 0);
#endif
#ifdef SIGIOT
  sigaction(SIGIOT, &act, 0);
#endif
#ifdef SIGBUS
  sigaction(SIGBUS, &act, 0);
#endif
#ifdef SIGFPE
  sigaction(SIGFPE, &act, 0);
#endif
#ifdef SIGUSR1
  sigaction(SIGUSR1, &act, 0);
#endif
#ifdef SIGSEGV
  sigaction(SIGSEGV, &act, 0);
#endif
#ifdef SIGUSR2
  sigaction(SIGUSR2, &act, 0);
#endif
#ifdef SIGPIPE
  sigaction(SIGPIPE, &act, 0);
#endif
#ifdef SIGALRM
  sigaction(SIGALRM, &act, 0);
#endif
#ifdef SIGTERM
  sigaction(SIGTERM, &act, 0);
#endif
#ifdef SIGSTKFLT
  sigaction(SIGSTKFLT, &act, 0);
#endif
#ifdef SIGCLD
  sigaction(SIGCLD, &act, 0);
#endif
#ifdef SIGCHLD
  sigaction(SIGCHLD, &act, 0);
#endif
#ifdef SIGCONT
  sigaction(SIGCONT, &act, 0);
#endif
#ifdef SIGTSTP
  sigaction(SIGTSTP, &act, 0);
#endif
#ifdef SIGTTIN
  sigaction(SIGTTIN, &act, 0);
#endif
#ifdef SIGTTOU
  sigaction(SIGTTOU, &act, 0);
#endif
#ifdef SIGURG
  sigaction(SIGURG, &act, 0);
#endif
#ifdef SIGXCPU
  sigaction(SIGXCPU, &act, 0);
#endif
#ifdef SIGXFSZ
  sigaction(SIGXFSZ, &act, 0);
#endif
#ifdef SIGVTALRM
  sigaction(SIGVTALRM, &act, 0);
#endif
#ifdef SIGPROF
  sigaction(SIGPROF, &act, 0);
#endif
#ifdef SIGWINCH
  sigaction(SIGWINCH, &act, 0);
#endif
#ifdef SIGPOLL
  sigaction(SIGPOLL, &act, 0);
#endif
#ifdef SIGIO
  sigaction(SIGIO, &act, 0);
#endif
#ifdef SIGPWR
  sigaction(SIGPWR, &act, 0);
#endif
#ifdef SIGSYS
  sigaction(SIGSYS, &act, 0);
#endif
#ifdef SIGUNUSED
  sigaction(SIGUNUSED, &act, 0);
#endif
}